

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding_x86_avx2.cpp
# Opt level: O3

int __thiscall
ncnn::Padding_x86_avx2::forward(Padding_x86_avx2 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 uVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  size_t sVar5;
  int *piVar6;
  int *piVar7;
  __m256 v;
  __m256 v_00;
  __m256 v_01;
  __m256 v_02;
  int iVar8;
  _func_int **pp_Var9;
  sbyte sVar10;
  uint uVar11;
  ulong uVar12;
  undefined1 (*pauVar13) [16];
  long lVar14;
  int iVar15;
  undefined1 (*pauVar16) [32];
  undefined1 (*pauVar17) [16];
  ulong uVar18;
  _func_int *p_Var19;
  undefined1 (*pauVar20) [32];
  Mat *pMVar21;
  uint uVar22;
  Mat *pMVar23;
  int iVar24;
  uint uVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  undefined1 (*pauVar30) [32];
  ulong uVar31;
  undefined1 (*pauVar32) [16];
  long lVar33;
  ulong uVar34;
  uint uVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined8 in_XMM1_Qa;
  __m128 v_03;
  __m128 v_04;
  __m128 v_05;
  __m128 v_06;
  Mat m;
  Option opt_pack1;
  undefined8 in_stack_fffffffffffffed0;
  Allocator *pAVar40;
  undefined8 in_stack_fffffffffffffed8;
  Padding_x86_avx2 *pPVar41;
  Padding_x86_avx2 *pPVar42;
  void *in_stack_fffffffffffffee8;
  void *pvVar43;
  undefined8 local_a8;
  Option local_78;
  
  p_Var19 = this->_vptr_Padding_x86_avx2[-3];
  uVar22 = *(uint *)(&this->field_0xd0 + (long)p_Var19);
  if (((((uVar22 == 0) && (*(int *)(&this->field_0xd4 + (long)p_Var19) == 0)) &&
       (*(int *)(&this->field_0xd8 + (long)p_Var19) == 0)) &&
      ((*(int *)(&this->field_0xdc + (long)p_Var19) == 0 &&
       (*(int *)(&this->field_0xe8 + (long)p_Var19) == 0)))) &&
     (*(int *)(&this->field_0xec + (long)p_Var19) == 0)) {
    Mat::operator=(top_blob,bottom_blob);
    return 0;
  }
  iVar8 = bottom_blob->elempack;
  uVar34 = bottom_blob->elemsize;
  if (iVar8 != 0) {
    if (((int)uVar34 * 8) / iVar8 == 8) {
      iVar8 = forward_int8(this,bottom_blob,top_blob,opt);
      return iVar8;
    }
    iVar26 = bottom_blob->w;
    iVar24 = bottom_blob->h;
    iVar2 = bottom_blob->d;
    uVar25 = bottom_blob->c;
    if (iVar8 == 4) {
      switch(bottom_blob->dims) {
      case 1:
        uVar22 = *(uint *)(&this->field_0xd8 + (long)p_Var19) + iVar26 * 4 +
                 *(int *)(&this->field_0xdc + (long)p_Var19);
        sVar10 = 3;
        if ((uVar22 & 7) != 0) {
          sVar10 = ((uVar22 & 3) == 0) * '\x02';
        }
        if ((((*(uint *)(&this->field_0xd8 + (long)p_Var19) & 3) == 0) && ((uVar22 & 7) == 4)) &&
           (*(int *)(&this->field_0xe0 + (long)p_Var19) == 0)) {
          Mat::create(top_blob,(int)uVar22 >> 2,(uVar34 >> 2) << sVar10,4,opt->blob_allocator);
          if ((Mat *)top_blob->data == (Mat *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep != 0) {
            p_Var19 = this->_vptr_Padding_x86_avx2[-3];
            iVar8 = *(int *)(&this->field_0xd8 + (long)p_Var19);
            iVar26 = iVar8 + 3;
            if (-1 < iVar8) {
              iVar26 = iVar8;
            }
            v_03[1] = (float)*(undefined4 *)(&this->field_0xe4 + (long)p_Var19);
            v_03[0] = (float)*(undefined4 *)(&this->field_0xe4 + (long)p_Var19);
            iVar8 = *(int *)(&this->field_0xdc + (long)p_Var19);
            iVar24 = iVar8 + 3;
            if (-1 < iVar8) {
              iVar24 = iVar8;
            }
            v_03[2] = (float)(int)in_XMM1_Qa;
            v_03[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
            padding_constant_pack4_sse
                      ((ncnn *)bottom_blob,(Mat *)top_blob->data,(Mat *)(ulong)(uint)top_blob->w,0,0
                       ,iVar26 >> 2,iVar24 >> 2,v_03);
            return 0;
          }
          return -100;
        }
        break;
      case 2:
        uVar25 = uVar22 + iVar24 * 4 + *(int *)(&this->field_0xd4 + (long)p_Var19);
        sVar10 = 3;
        if ((uVar25 & 7) != 0) {
          sVar10 = ((uVar25 & 3) == 0) * '\x02';
        }
        if ((((uVar22 & 3) == 0) && ((uVar25 & 7) == 4)) &&
           (*(int *)(&this->field_0xe0 + (long)p_Var19) == 0)) {
          Mat::create(top_blob,iVar26 + *(int *)(&this->field_0xd8 + (long)p_Var19) +
                               *(int *)(&this->field_0xdc + (long)p_Var19),(int)uVar25 >> 2,
                      (uVar34 >> 2) << sVar10,4,opt->blob_allocator);
          if ((Mat *)top_blob->data == (Mat *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep != 0) {
            p_Var19 = this->_vptr_Padding_x86_avx2[-3];
            v_06[1] = (float)*(undefined4 *)(&this->field_0xe4 + (long)p_Var19);
            v_06[0] = (float)*(undefined4 *)(&this->field_0xe4 + (long)p_Var19);
            iVar8 = *(int *)(&this->field_0xd0 + (long)p_Var19);
            iVar26 = *(int *)(&this->field_0xd4 + (long)p_Var19);
            iVar24 = iVar8 + 3;
            if (-1 < iVar8) {
              iVar24 = iVar8;
            }
            iVar8 = iVar26 + 3;
            if (-1 < iVar26) {
              iVar8 = iVar26;
            }
            v_06[2] = (float)(int)in_XMM1_Qa;
            v_06[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
            padding_constant_pack4_sse
                      ((ncnn *)bottom_blob,(Mat *)top_blob->data,(Mat *)(ulong)(uint)top_blob->w,
                       iVar24 >> 2,iVar8 >> 2,*(int *)(&this->field_0xd8 + (long)p_Var19),
                       *(int *)(&this->field_0xdc + (long)p_Var19),v_06);
            return 0;
          }
          return -100;
        }
        break;
      case 3:
        uVar11 = *(uint *)(&this->field_0xe8 + (long)p_Var19) + uVar25 * 4 +
                 *(int *)(&this->field_0xec + (long)p_Var19);
        sVar10 = ((uVar11 & 3) == 0) * '\x02';
        if ((uVar11 & 7) == 0) {
          sVar10 = 3;
        }
        if (((*(uint *)(&this->field_0xe8 + (long)p_Var19) & 3) == 0) && ((uVar11 & 7) == 4)) {
          if ((uVar11 == uVar25 * 4) || (*(int *)(&this->field_0xe0 + (long)p_Var19) == 0)) {
            uVar11 = (int)uVar11 >> 2;
            Mat::create(top_blob,iVar26 + *(int *)(&this->field_0xd8 + (long)p_Var19) +
                                 *(int *)(&this->field_0xdc + (long)p_Var19),
                        uVar22 + iVar24 + *(int *)(&this->field_0xd4 + (long)p_Var19),uVar11,
                        (uVar34 >> 2) << sVar10,4,opt->blob_allocator);
            if (top_blob->data == (void *)0x0) {
              return -100;
            }
            if ((long)top_blob->c * top_blob->cstep != 0) {
              iVar8 = *(int *)(&this->field_0xe8 + (long)this->_vptr_Padding_x86_avx2[-3]);
              iVar26 = iVar8 + 3;
              if (-1 < iVar8) {
                iVar26 = iVar8;
              }
              if ((int)uVar11 < 1) {
                return 0;
              }
              uVar34 = 0;
              do {
                iVar8 = 1;
                if (top_blob->dims != 3) {
                  iVar8 = top_blob->d;
                }
                pp_Var9 = this->_vptr_Padding_x86_avx2;
                p_Var19 = pp_Var9[-3];
                if (*(int *)(&this->field_0xf0 + (long)p_Var19) == 0) {
                  uVar1 = *(undefined4 *)(&this->field_0xe4 + (long)p_Var19);
                  auVar36._4_4_ = uVar1;
                  auVar36._0_4_ = uVar1;
                  auVar36._8_4_ = uVar1;
                  auVar36._12_4_ = uVar1;
                }
                else {
                  auVar36 = *(undefined1 (*) [16])
                             (*(long *)(&this->field_0xf8 + (long)p_Var19) + uVar34 * 0x10);
                }
                pvVar43 = top_blob->data;
                sVar5 = top_blob->elemsize;
                sVar4 = top_blob->cstep;
                uVar22 = (int)uVar34 - (iVar26 >> 2);
                if ((int)uVar22 < 0 || (int)uVar25 <= (int)uVar22) {
                  uVar22 = iVar8 * top_blob->w * top_blob->h;
                  if (0 < (int)uVar22) {
                    lVar14 = 0;
                    do {
                      *(undefined1 (*) [16])((long)pvVar43 + lVar14 + sVar4 * sVar5 * uVar34) =
                           auVar36;
                      lVar14 = lVar14 + 0x10;
                    } while ((ulong)uVar22 << 4 != lVar14);
                  }
                }
                else {
                  pMVar21 = (Mat *)((long)pvVar43 + sVar4 * uVar34 * sVar5);
                  uVar35 = bottom_blob->w;
                  iVar8 = bottom_blob->h;
                  pauVar17 = (undefined1 (*) [16])
                             ((ulong)uVar22 * bottom_blob->cstep * bottom_blob->elemsize +
                             (long)bottom_blob->data);
                  iVar24 = *(int *)(&this->field_0xe0 + (long)p_Var19);
                  pauVar13 = pauVar17;
                  if (iVar24 == 0) {
                    v_04._0_8_ = auVar36._0_8_;
                    v_04[2] = (float)(int)in_XMM1_Qa;
                    v_04[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
                    pPVar41 = this;
                    padding_constant_pack4_sse
                              ((ncnn *)&stack0xfffffffffffffee8,pMVar21,
                               (Mat *)(ulong)(uint)top_blob->w,
                               *(int *)(&this->field_0xd0 + (long)p_Var19),
                               *(int *)(&this->field_0xd4 + (long)p_Var19),
                               *(int *)(&this->field_0xd8 + (long)p_Var19),
                               *(int *)(&this->field_0xdc + (long)p_Var19),v_04);
                    pp_Var9 = this->_vptr_Padding_x86_avx2;
                    p_Var19 = pp_Var9[-3];
                    iVar24 = *(int *)(&this->field_0xe0 + (long)p_Var19);
                    this = pPVar41;
                  }
                  if (iVar24 == 1) {
                    iVar24 = *(int *)(&this->field_0xd0 + (long)p_Var19);
                    iVar2 = *(int *)(&this->field_0xd4 + (long)p_Var19);
                    iVar29 = *(int *)(&this->field_0xd8 + (long)p_Var19);
                    iVar15 = *(int *)(&this->field_0xdc + (long)p_Var19);
                    pMVar23 = pMVar21;
                    if (0 < iVar24) {
                      iVar27 = 0;
                      do {
                        auVar37 = *pauVar17;
                        iVar28 = iVar29;
                        if (0 < iVar29) {
                          do {
                            pMVar23->data = (void *)auVar37._0_8_;
                            pMVar23->refcount = (int *)auVar37._8_8_;
                            pMVar23 = (Mat *)&pMVar23->elemsize;
                            iVar28 = iVar28 + -1;
                          } while (iVar28 != 0);
                        }
                        if (0 < (int)uVar35) {
                          iVar28 = 0;
                          pauVar32 = pauVar17;
                          do {
                            auVar37 = *pauVar32;
                            pMVar23->data = (void *)auVar37._0_8_;
                            pMVar23->refcount = (int *)auVar37._8_8_;
                            pauVar32 = pauVar32 + 1;
                            pMVar23 = (Mat *)&pMVar23->elemsize;
                            iVar28 = iVar28 + 1;
                          } while (iVar28 < (int)uVar35);
                        }
                        iVar28 = iVar15;
                        if (0 < iVar15) {
                          do {
                            pMVar23->data = (void *)auVar37._0_8_;
                            pMVar23->refcount = (int *)auVar37._8_8_;
                            pMVar23 = (Mat *)&pMVar23->elemsize;
                            iVar28 = iVar28 + -1;
                          } while (iVar28 != 0);
                        }
                        iVar27 = iVar27 + 1;
                      } while (iVar27 != iVar24);
                    }
                    if (0 < iVar8) {
                      iVar24 = 0;
                      do {
                        auVar37 = *pauVar17;
                        iVar27 = iVar29;
                        if (0 < iVar29) {
                          do {
                            pMVar23->data = (void *)auVar37._0_8_;
                            pMVar23->refcount = (int *)auVar37._8_8_;
                            pMVar23 = (Mat *)&pMVar23->elemsize;
                            iVar27 = iVar27 + -1;
                          } while (iVar27 != 0);
                        }
                        if (0 < (int)uVar35) {
                          iVar27 = 0;
                          do {
                            auVar37 = *pauVar17;
                            pMVar23->data = (void *)auVar37._0_8_;
                            pMVar23->refcount = (int *)auVar37._8_8_;
                            pauVar17 = pauVar17 + 1;
                            pMVar23 = (Mat *)&pMVar23->elemsize;
                            iVar27 = iVar27 + 1;
                          } while (iVar27 < (int)uVar35);
                        }
                        iVar27 = iVar15;
                        if (0 < iVar15) {
                          do {
                            pMVar23->data = (void *)auVar37._0_8_;
                            pMVar23->refcount = (int *)auVar37._8_8_;
                            pMVar23 = (Mat *)&pMVar23->elemsize;
                            iVar27 = iVar27 + -1;
                          } while (iVar27 != 0);
                        }
                        iVar24 = iVar24 + 1;
                      } while (iVar24 < iVar8);
                    }
                    if (0 < iVar2) {
                      iVar24 = 0;
                      do {
                        auVar37 = pauVar17[-(long)(int)uVar35];
                        iVar27 = iVar29;
                        if (0 < iVar29) {
                          do {
                            pMVar23->data = (void *)auVar37._0_8_;
                            pMVar23->refcount = (int *)auVar37._8_8_;
                            pMVar23 = (Mat *)&pMVar23->elemsize;
                            iVar27 = iVar27 + -1;
                          } while (iVar27 != 0);
                        }
                        if (0 < (int)uVar35) {
                          iVar27 = 0;
                          pauVar32 = pauVar17 + -(long)(int)uVar35;
                          do {
                            auVar37 = *pauVar32;
                            pMVar23->data = (void *)auVar37._0_8_;
                            pMVar23->refcount = (int *)auVar37._8_8_;
                            pauVar32 = pauVar32 + 1;
                            pMVar23 = (Mat *)&pMVar23->elemsize;
                            iVar27 = iVar27 + 1;
                          } while (iVar27 < (int)uVar35);
                        }
                        iVar27 = iVar15;
                        if (0 < iVar15) {
                          do {
                            pMVar23->data = (void *)auVar37._0_8_;
                            pMVar23->refcount = (int *)auVar37._8_8_;
                            pMVar23 = (Mat *)&pMVar23->elemsize;
                            iVar27 = iVar27 + -1;
                          } while (iVar27 != 0);
                        }
                        iVar24 = iVar24 + 1;
                      } while (iVar24 != iVar2);
                    }
                  }
                  p_Var19 = pp_Var9[-3];
                  if (*(int *)(&this->field_0xe0 + (long)p_Var19) == 2) {
                    iVar24 = *(int *)(&this->field_0xd0 + (long)p_Var19);
                    iVar2 = *(int *)(&this->field_0xd4 + (long)p_Var19);
                    uVar22 = *(uint *)(&this->field_0xd8 + (long)p_Var19);
                    uVar18 = (ulong)uVar22;
                    uVar3 = *(uint *)(&this->field_0xdc + (long)p_Var19);
                    uVar12 = (ulong)uVar3;
                    pauVar13 = (undefined1 (*) [16])
                               (*pauVar13 + (long)(int)(iVar24 * uVar35 * 4) * 4);
                    if (0 < iVar24) {
                      iVar29 = 0;
                      do {
                        lVar14 = uVar18 << 4;
                        if (0 < (int)uVar22) {
                          do {
                            *(undefined1 (*) [16])pMVar21 =
                                 *(undefined1 (*) [16])(*pauVar13 + lVar14);
                            pMVar21 = (Mat *)&pMVar21->elemsize;
                            lVar14 = lVar14 + -0x10;
                          } while (lVar14 != 0);
                        }
                        pauVar17 = pauVar13;
                        if (0 < (int)uVar35) {
                          iVar15 = 0;
                          do {
                            *(undefined1 (*) [16])pMVar21 = *pauVar17;
                            pauVar17 = pauVar17 + 1;
                            pMVar21 = (Mat *)&pMVar21->elemsize;
                            iVar15 = iVar15 + 1;
                          } while (iVar15 < (int)uVar35);
                        }
                        if (0 < (int)uVar3) {
                          lVar14 = -0x20;
                          do {
                            *(undefined1 (*) [16])pMVar21 =
                                 *(undefined1 (*) [16])(*pauVar17 + lVar14);
                            pMVar21 = (Mat *)&pMVar21->elemsize;
                            lVar33 = uVar12 * 0x10 + lVar14;
                            lVar14 = lVar14 + -0x10;
                          } while (lVar33 != -0x10);
                        }
                        pauVar13 = (undefined1 (*) [16])
                                   ((long)pauVar13 + (long)(int)(uVar35 * 4) * -4);
                        iVar29 = iVar29 + 1;
                      } while (iVar29 != iVar24);
                    }
                    if (0 < iVar8) {
                      iVar24 = 0;
                      do {
                        lVar14 = uVar18 << 4;
                        if (0 < (int)uVar22) {
                          do {
                            *(undefined1 (*) [16])pMVar21 =
                                 *(undefined1 (*) [16])(*pauVar13 + lVar14);
                            pMVar21 = (Mat *)&pMVar21->elemsize;
                            lVar14 = lVar14 + -0x10;
                          } while (lVar14 != 0);
                        }
                        if (0 < (int)uVar35) {
                          iVar29 = 0;
                          do {
                            *(undefined1 (*) [16])pMVar21 = *pauVar13;
                            pauVar13 = pauVar13 + 1;
                            pMVar21 = (Mat *)&pMVar21->elemsize;
                            iVar29 = iVar29 + 1;
                          } while (iVar29 < (int)uVar35);
                        }
                        if (0 < (int)uVar3) {
                          lVar14 = -0x20;
                          do {
                            *(undefined1 (*) [16])pMVar21 =
                                 *(undefined1 (*) [16])(*pauVar13 + lVar14);
                            pMVar21 = (Mat *)&pMVar21->elemsize;
                            lVar33 = uVar12 * 0x10 + lVar14;
                            lVar14 = lVar14 + -0x10;
                          } while (lVar33 != -0x10);
                        }
                        iVar24 = iVar24 + 1;
                      } while (iVar24 < iVar8);
                    }
                    if (0 < iVar2) {
                      uVar31 = (ulong)(int)uVar35;
                      pauVar13 = pauVar13 + uVar31 * -2;
                      iVar8 = 0;
                      do {
                        lVar14 = uVar18 << 4;
                        if (0 < (int)uVar22) {
                          do {
                            *(undefined1 (*) [16])pMVar21 =
                                 *(undefined1 (*) [16])(*pauVar13 + lVar14);
                            pMVar21 = (Mat *)&pMVar21->elemsize;
                            lVar14 = lVar14 + -0x10;
                          } while (lVar14 != 0);
                          uVar31 = (ulong)uVar35;
                        }
                        pauVar17 = pauVar13;
                        if (0 < (int)uVar31) {
                          iVar24 = 0;
                          do {
                            *(undefined1 (*) [16])pMVar21 = *pauVar17;
                            pauVar17 = pauVar17 + 1;
                            pMVar21 = (Mat *)&pMVar21->elemsize;
                            iVar24 = iVar24 + 1;
                            uVar31 = (ulong)uVar35;
                          } while (iVar24 < (int)uVar35);
                        }
                        if (0 < (int)uVar3) {
                          lVar14 = -0x20;
                          do {
                            *(undefined1 (*) [16])pMVar21 =
                                 *(undefined1 (*) [16])(*pauVar17 + lVar14);
                            pMVar21 = (Mat *)&pMVar21->elemsize;
                            lVar33 = uVar12 * 0x10 + lVar14;
                            lVar14 = lVar14 + -0x10;
                          } while (lVar33 != -0x10);
                          uVar31 = (ulong)uVar35;
                        }
                        pauVar13 = (undefined1 (*) [16])
                                   ((long)pauVar13 + (long)((int)uVar31 * 4) * -4);
                        iVar8 = iVar8 + 1;
                      } while (iVar8 != iVar2);
                    }
                  }
                }
                uVar34 = uVar34 + 1;
              } while (uVar34 != uVar11);
              return 0;
            }
            return -100;
          }
        }
        break;
      case 4:
        if (*(int *)(&this->field_0xe0 + (long)p_Var19) == 0) {
          uVar11 = *(int *)(&this->field_0xe8 + (long)p_Var19) + iVar2 +
                   *(int *)(&this->field_0xec + (long)p_Var19);
          Mat::create(top_blob,iVar26 + *(int *)(&this->field_0xd8 + (long)p_Var19) +
                               *(int *)(&this->field_0xdc + (long)p_Var19),
                      uVar22 + iVar24 + *(int *)(&this->field_0xd4 + (long)p_Var19),uVar11,uVar25,
                      uVar34,4,opt->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep != 0) {
            if ((int)uVar25 < 1) {
              return 0;
            }
            uVar34 = 0;
            do {
              p_Var19 = this->_vptr_Padding_x86_avx2[-3];
              if (*(int *)(&this->field_0xf0 + (long)p_Var19) == 0) {
                uVar1 = *(undefined4 *)(&this->field_0xe4 + (long)p_Var19);
                auVar37._4_4_ = uVar1;
                auVar37._0_4_ = uVar1;
                auVar37._8_4_ = uVar1;
                auVar37._12_4_ = uVar1;
              }
              else {
                auVar37 = *(undefined1 (*) [16])
                           (*(long *)(&this->field_0xf8 + (long)p_Var19) + uVar34 * 0x10);
              }
              pPVar41 = this;
              if (0 < (int)uVar11) {
                uVar18 = 0;
                do {
                  pMVar21 = (Mat *)(long)top_blob->w;
                  sVar5 = top_blob->elemsize;
                  lVar33 = top_blob->cstep * uVar34;
                  lVar14 = (long)top_blob->h * (long)pMVar21;
                  p_Var19 = this->_vptr_Padding_x86_avx2[-3];
                  iVar8 = (int)uVar18 - *(int *)(&this->field_0xe8 + (long)p_Var19);
                  if (iVar8 < 0 || iVar2 <= iVar8) {
                    uVar22 = (uint)lVar14;
                    if (0 < (int)uVar22) {
                      uVar12 = (ulong)(uVar22 & 0x7fffffff);
                      pauVar13 = (undefined1 (*) [16])
                                 ((long)top_blob->data +
                                 sVar5 * ((long)top_blob->h * uVar18 * (long)pMVar21 + lVar33));
                      do {
                        *pauVar13 = auVar37;
                        pauVar13 = pauVar13 + 1;
                        uVar12 = uVar12 - 1;
                      } while (uVar12 != 0);
                    }
                  }
                  else {
                    local_a8 = auVar37._0_8_;
                    v_05[2] = (float)(int)in_XMM1_Qa;
                    v_05[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
                    v_05[0] = (float)(undefined4)local_a8;
                    v_05[1] = (float)local_a8._4_4_;
                    pPVar42 = pPVar41;
                    padding_constant_pack4_sse
                              ((ncnn *)&stack0xfffffffffffffee8,
                               (Mat *)((long)top_blob->data +
                                      lVar14 * sVar5 * uVar18 + lVar33 * sVar5),pMVar21,
                               *(int *)(&pPVar41->field_0xd0 + (long)p_Var19),
                               *(int *)(&pPVar41->field_0xd4 + (long)p_Var19),
                               *(int *)(&pPVar41->field_0xd8 + (long)p_Var19),
                               *(int *)(&pPVar41->field_0xdc + (long)p_Var19),v_05);
                    this = pPVar41;
                    pPVar41 = pPVar42;
                  }
                  uVar18 = uVar18 + 1;
                } while (uVar18 != uVar11);
              }
              uVar34 = uVar34 + 1;
              this = pPVar41;
            } while (uVar34 != uVar25);
            return 0;
          }
          return -100;
        }
      }
    }
    else if (iVar8 == 8) {
      switch(bottom_blob->dims) {
      case 1:
        uVar22 = *(uint *)(&this->field_0xd8 + (long)p_Var19) + iVar26 * 8 +
                 *(int *)(&this->field_0xdc + (long)p_Var19);
        sVar10 = 3;
        if ((uVar22 & 7) != 0) {
          sVar10 = ((uVar22 & 3) == 0) * '\x02';
        }
        if ((((*(uint *)(&this->field_0xd8 + (long)p_Var19) | uVar22) & 7) == 0) &&
           (*(int *)(&this->field_0xe0 + (long)p_Var19) == 0)) {
          uVar25 = uVar22 + 7;
          if (-1 < (int)uVar22) {
            uVar25 = uVar22;
          }
          Mat::create(top_blob,(int)uVar25 >> 3,(uVar34 >> 3) << sVar10,8,opt->blob_allocator);
          if ((Mat *)top_blob->data != (Mat *)0x0) {
            if ((long)top_blob->c * top_blob->cstep != 0) {
              iVar8 = *(int *)(&this->field_0xd8 + (long)this->_vptr_Padding_x86_avx2[-3]);
              iVar26 = iVar8 + 7;
              if (-1 < iVar8) {
                iVar26 = iVar8;
              }
              iVar8 = *(int *)(&this->field_0xdc + (long)this->_vptr_Padding_x86_avx2[-3]);
              iVar24 = iVar8 + 7;
              if (-1 < iVar8) {
                iVar24 = iVar8;
              }
              v[2] = (float)(int)in_stack_fffffffffffffed8;
              v[3] = (float)(int)((ulong)in_stack_fffffffffffffed8 >> 0x20);
              v[0] = (float)(int)in_stack_fffffffffffffed0;
              v[1] = (float)(int)((ulong)in_stack_fffffffffffffed0 >> 0x20);
              v._16_8_ = this;
              v._24_8_ = in_stack_fffffffffffffee8;
              padding_constant_pack8_avx
                        ((ncnn *)bottom_blob,(Mat *)top_blob->data,(Mat *)(ulong)(uint)top_blob->w,0
                         ,0,iVar26 >> 3,iVar24 >> 3,v);
              return 0;
            }
            return -100;
          }
          return -100;
        }
        break;
      case 2:
        uVar25 = uVar22 + iVar24 * 8 + *(int *)(&this->field_0xd4 + (long)p_Var19);
        sVar10 = 3;
        if ((uVar25 & 7) != 0) {
          sVar10 = ((uVar25 & 3) == 0) * '\x02';
        }
        if ((((uVar22 | uVar25) & 7) == 0) && (*(int *)(&this->field_0xe0 + (long)p_Var19) == 0)) {
          uVar22 = uVar25 + 7;
          if (-1 < (int)uVar25) {
            uVar22 = uVar25;
          }
          Mat::create(top_blob,iVar26 + *(int *)(&this->field_0xd8 + (long)p_Var19) +
                               *(int *)(&this->field_0xdc + (long)p_Var19),(int)uVar22 >> 3,
                      (uVar34 >> 3) << sVar10,8,opt->blob_allocator);
          if ((Mat *)top_blob->data != (Mat *)0x0) {
            if ((long)top_blob->c * top_blob->cstep != 0) {
              p_Var19 = this->_vptr_Padding_x86_avx2[-3];
              iVar8 = *(int *)(&this->field_0xd0 + (long)p_Var19);
              iVar26 = *(int *)(&this->field_0xd4 + (long)p_Var19);
              iVar24 = iVar8 + 7;
              if (-1 < iVar8) {
                iVar24 = iVar8;
              }
              iVar8 = iVar26 + 7;
              if (-1 < iVar26) {
                iVar8 = iVar26;
              }
              v_02[2] = (float)(int)in_stack_fffffffffffffed8;
              v_02[3] = (float)(int)((ulong)in_stack_fffffffffffffed8 >> 0x20);
              v_02[0] = (float)(int)in_stack_fffffffffffffed0;
              v_02[1] = (float)(int)((ulong)in_stack_fffffffffffffed0 >> 0x20);
              v_02._16_8_ = this;
              v_02._24_8_ = in_stack_fffffffffffffee8;
              padding_constant_pack8_avx
                        ((ncnn *)bottom_blob,(Mat *)top_blob->data,(Mat *)(ulong)(uint)top_blob->w,
                         iVar24 >> 3,iVar8 >> 3,*(int *)(&this->field_0xd8 + (long)p_Var19),
                         *(int *)(&this->field_0xdc + (long)p_Var19),v_02);
              return 0;
            }
            return -100;
          }
          return -100;
        }
        break;
      case 3:
        uVar11 = *(uint *)(&this->field_0xe8 + (long)p_Var19) + uVar25 * 8 +
                 *(int *)(&this->field_0xec + (long)p_Var19);
        sVar10 = ((uVar11 & 3) == 0) * '\x02';
        if ((uVar11 & 7) == 0) {
          sVar10 = 3;
        }
        if (((*(uint *)(&this->field_0xe8 + (long)p_Var19) | uVar11) & 7) == 0) {
          if ((uVar11 == uVar25 * 8) || (*(int *)(&this->field_0xe0 + (long)p_Var19) == 0)) {
            uVar35 = uVar11 + 7;
            if (-1 < (int)uVar11) {
              uVar35 = uVar11;
            }
            Mat::create(top_blob,iVar26 + *(int *)(&this->field_0xd8 + (long)p_Var19) +
                                 *(int *)(&this->field_0xdc + (long)p_Var19),
                        uVar22 + iVar24 + *(int *)(&this->field_0xd4 + (long)p_Var19),
                        (int)uVar35 >> 3,(uVar34 >> 3) << sVar10,8,opt->blob_allocator);
            if (top_blob->data == (void *)0x0) {
              return -100;
            }
            if ((long)top_blob->c * top_blob->cstep == 0) {
              return -100;
            }
            iVar8 = *(int *)(&this->field_0xe8 + (long)this->_vptr_Padding_x86_avx2[-3]);
            iVar26 = iVar8 + 7;
            if (-1 < iVar8) {
              iVar26 = iVar8;
            }
            if ((int)uVar11 < 8) {
              return 0;
            }
            uVar34 = 0;
            do {
              iVar8 = 1;
              if (top_blob->dims != 3) {
                iVar8 = top_blob->d;
              }
              pp_Var9 = this->_vptr_Padding_x86_avx2;
              p_Var19 = pp_Var9[-3];
              if (*(int *)(&this->field_0xf0 + (long)p_Var19) == 0) {
                uVar1 = *(undefined4 *)(&this->field_0xe4 + (long)p_Var19);
                auVar38._4_4_ = uVar1;
                auVar38._0_4_ = uVar1;
                auVar38._8_4_ = uVar1;
                auVar38._12_4_ = uVar1;
                auVar38._16_4_ = uVar1;
                auVar38._20_4_ = uVar1;
                auVar38._24_4_ = uVar1;
                auVar38._28_4_ = uVar1;
              }
              else {
                auVar38 = *(undefined1 (*) [32])
                           (*(long *)(&this->field_0xf8 + (long)p_Var19) + uVar34 * 0x20);
              }
              pMVar21 = (Mat *)(top_blob->cstep * uVar34 * top_blob->elemsize + (long)top_blob->data
                               );
              uVar22 = (int)uVar34 - (iVar26 >> 3);
              if ((int)uVar22 < 0 || (int)uVar25 <= (int)uVar22) {
                iVar8 = iVar8 * top_blob->w * top_blob->h;
                if (0 < iVar8) {
                  do {
                    pMVar21->data = (void *)auVar38._0_8_;
                    pMVar21->refcount = (int *)auVar38._8_8_;
                    pMVar21->elemsize = auVar38._16_8_;
                    pMVar21->elempack = auVar38._24_4_;
                    *(int *)&pMVar21->field_0x1c = auVar38._28_4_;
                    pMVar21 = (Mat *)&pMVar21->allocator;
                    iVar8 = iVar8 + -1;
                  } while (iVar8 != 0);
                }
              }
              else {
                uVar11 = bottom_blob->w;
                iVar8 = bottom_blob->h;
                pauVar16 = (undefined1 (*) [32])
                           ((ulong)uVar22 * bottom_blob->cstep * bottom_blob->elemsize +
                           (long)bottom_blob->data);
                iVar24 = *(int *)(&this->field_0xe0 + (long)p_Var19);
                pauVar20 = pauVar16;
                if (iVar24 == 0) {
                  v_00[2] = (float)(int)in_stack_fffffffffffffed8;
                  v_00[3] = (float)(int)((ulong)in_stack_fffffffffffffed8 >> 0x20);
                  v_00[0] = (float)(int)in_stack_fffffffffffffed0;
                  v_00[1] = (float)(int)((ulong)in_stack_fffffffffffffed0 >> 0x20);
                  v_00._16_8_ = this;
                  v_00._24_8_ = pauVar16;
                  pPVar41 = this;
                  padding_constant_pack8_avx
                            ((ncnn *)&stack0xfffffffffffffee8,pMVar21,
                             (Mat *)(ulong)(uint)top_blob->w,
                             *(int *)(&this->field_0xd0 + (long)p_Var19),
                             *(int *)(&this->field_0xd4 + (long)p_Var19),
                             *(int *)(&this->field_0xd8 + (long)p_Var19),
                             *(int *)(&this->field_0xdc + (long)p_Var19),v_00);
                  pp_Var9 = this->_vptr_Padding_x86_avx2;
                  p_Var19 = pp_Var9[-3];
                  iVar24 = *(int *)(&this->field_0xe0 + (long)p_Var19);
                  this = pPVar41;
                }
                if (iVar24 == 1) {
                  iVar24 = *(int *)(&this->field_0xd0 + (long)p_Var19);
                  iVar2 = *(int *)(&this->field_0xd4 + (long)p_Var19);
                  iVar29 = *(int *)(&this->field_0xd8 + (long)p_Var19);
                  iVar15 = *(int *)(&this->field_0xdc + (long)p_Var19);
                  pMVar23 = pMVar21;
                  if (0 < iVar24) {
                    iVar27 = 0;
                    do {
                      auVar39 = *pauVar16;
                      iVar28 = iVar29;
                      if (0 < iVar29) {
                        do {
                          pMVar23->data = (void *)auVar39._0_8_;
                          pMVar23->refcount = (int *)auVar39._8_8_;
                          pMVar23->elemsize = auVar39._16_8_;
                          pMVar23->elempack = auVar39._24_4_;
                          *(int *)&pMVar23->field_0x1c = auVar39._28_4_;
                          pMVar23 = (Mat *)&pMVar23->allocator;
                          iVar28 = iVar28 + -1;
                        } while (iVar28 != 0);
                      }
                      if (0 < (int)uVar11) {
                        iVar28 = 0;
                        pauVar30 = pauVar16;
                        do {
                          auVar39 = *pauVar30;
                          pMVar23->data = (void *)auVar39._0_8_;
                          pMVar23->refcount = (int *)auVar39._8_8_;
                          pMVar23->elemsize = auVar39._16_8_;
                          pMVar23->elempack = auVar39._24_4_;
                          *(int *)&pMVar23->field_0x1c = auVar39._28_4_;
                          pauVar30 = pauVar30 + 1;
                          pMVar23 = (Mat *)&pMVar23->allocator;
                          iVar28 = iVar28 + 1;
                        } while (iVar28 < (int)uVar11);
                      }
                      iVar28 = iVar15;
                      if (0 < iVar15) {
                        do {
                          pMVar23->data = (void *)auVar39._0_8_;
                          pMVar23->refcount = (int *)auVar39._8_8_;
                          pMVar23->elemsize = auVar39._16_8_;
                          pMVar23->elempack = auVar39._24_4_;
                          *(int *)&pMVar23->field_0x1c = auVar39._28_4_;
                          pMVar23 = (Mat *)&pMVar23->allocator;
                          iVar28 = iVar28 + -1;
                        } while (iVar28 != 0);
                      }
                      iVar27 = iVar27 + 1;
                    } while (iVar27 != iVar24);
                  }
                  if (0 < iVar8) {
                    iVar24 = 0;
                    do {
                      auVar39 = *pauVar16;
                      iVar27 = iVar29;
                      if (0 < iVar29) {
                        do {
                          pMVar23->data = (void *)auVar39._0_8_;
                          pMVar23->refcount = (int *)auVar39._8_8_;
                          pMVar23->elemsize = auVar39._16_8_;
                          pMVar23->elempack = auVar39._24_4_;
                          *(int *)&pMVar23->field_0x1c = auVar39._28_4_;
                          pMVar23 = (Mat *)&pMVar23->allocator;
                          iVar27 = iVar27 + -1;
                        } while (iVar27 != 0);
                      }
                      if (0 < (int)uVar11) {
                        iVar27 = 0;
                        do {
                          auVar39 = *pauVar16;
                          pMVar23->data = (void *)auVar39._0_8_;
                          pMVar23->refcount = (int *)auVar39._8_8_;
                          pMVar23->elemsize = auVar39._16_8_;
                          pMVar23->elempack = auVar39._24_4_;
                          *(int *)&pMVar23->field_0x1c = auVar39._28_4_;
                          pauVar16 = pauVar16 + 1;
                          pMVar23 = (Mat *)&pMVar23->allocator;
                          iVar27 = iVar27 + 1;
                        } while (iVar27 < (int)uVar11);
                      }
                      iVar27 = iVar15;
                      if (0 < iVar15) {
                        do {
                          pMVar23->data = (void *)auVar39._0_8_;
                          pMVar23->refcount = (int *)auVar39._8_8_;
                          pMVar23->elemsize = auVar39._16_8_;
                          pMVar23->elempack = auVar39._24_4_;
                          *(int *)&pMVar23->field_0x1c = auVar39._28_4_;
                          pMVar23 = (Mat *)&pMVar23->allocator;
                          iVar27 = iVar27 + -1;
                        } while (iVar27 != 0);
                      }
                      iVar24 = iVar24 + 1;
                    } while (iVar24 < iVar8);
                  }
                  if (0 < iVar2) {
                    iVar24 = 0;
                    do {
                      auVar39 = pauVar16[-(long)(int)uVar11];
                      iVar27 = iVar29;
                      if (0 < iVar29) {
                        do {
                          pMVar23->data = (void *)auVar39._0_8_;
                          pMVar23->refcount = (int *)auVar39._8_8_;
                          pMVar23->elemsize = auVar39._16_8_;
                          pMVar23->elempack = auVar39._24_4_;
                          *(int *)&pMVar23->field_0x1c = auVar39._28_4_;
                          pMVar23 = (Mat *)&pMVar23->allocator;
                          iVar27 = iVar27 + -1;
                        } while (iVar27 != 0);
                      }
                      if (0 < (int)uVar11) {
                        iVar27 = 0;
                        pauVar30 = pauVar16 + -(long)(int)uVar11;
                        do {
                          auVar39 = *pauVar30;
                          pMVar23->data = (void *)auVar39._0_8_;
                          pMVar23->refcount = (int *)auVar39._8_8_;
                          pMVar23->elemsize = auVar39._16_8_;
                          pMVar23->elempack = auVar39._24_4_;
                          *(int *)&pMVar23->field_0x1c = auVar39._28_4_;
                          pauVar30 = pauVar30 + 1;
                          pMVar23 = (Mat *)&pMVar23->allocator;
                          iVar27 = iVar27 + 1;
                        } while (iVar27 < (int)uVar11);
                      }
                      iVar27 = iVar15;
                      if (0 < iVar15) {
                        do {
                          pMVar23->data = (void *)auVar39._0_8_;
                          pMVar23->refcount = (int *)auVar39._8_8_;
                          pMVar23->elemsize = auVar39._16_8_;
                          pMVar23->elempack = auVar39._24_4_;
                          *(int *)&pMVar23->field_0x1c = auVar39._28_4_;
                          pMVar23 = (Mat *)&pMVar23->allocator;
                          iVar27 = iVar27 + -1;
                        } while (iVar27 != 0);
                      }
                      iVar24 = iVar24 + 1;
                    } while (iVar24 != iVar2);
                  }
                }
                p_Var19 = pp_Var9[-3];
                if (*(int *)(&this->field_0xe0 + (long)p_Var19) == 2) {
                  iVar24 = *(int *)(&this->field_0xd0 + (long)p_Var19);
                  iVar2 = *(int *)(&this->field_0xd4 + (long)p_Var19);
                  uVar22 = *(uint *)(&this->field_0xd8 + (long)p_Var19);
                  uVar18 = (ulong)uVar22;
                  uVar3 = *(uint *)(&this->field_0xdc + (long)p_Var19);
                  uVar12 = (ulong)uVar3;
                  pauVar20 = (undefined1 (*) [32])(*pauVar20 + (long)(int)(iVar24 * uVar11 * 8) * 4)
                  ;
                  if (0 < iVar24) {
                    iVar29 = 0;
                    do {
                      lVar14 = uVar18 << 5;
                      if (0 < (int)uVar22) {
                        do {
                          *(undefined1 (*) [32])pMVar21 = *(undefined1 (*) [32])(*pauVar20 + lVar14)
                          ;
                          pMVar21 = (Mat *)&pMVar21->allocator;
                          lVar14 = lVar14 + -0x20;
                        } while (lVar14 != 0);
                      }
                      pauVar16 = pauVar20;
                      if (0 < (int)uVar11) {
                        iVar15 = 0;
                        do {
                          *(undefined1 (*) [32])pMVar21 = *pauVar16;
                          pauVar16 = pauVar16 + 1;
                          pMVar21 = (Mat *)&pMVar21->allocator;
                          iVar15 = iVar15 + 1;
                        } while (iVar15 < (int)uVar11);
                      }
                      if (0 < (int)uVar3) {
                        lVar14 = -0x40;
                        do {
                          *(undefined1 (*) [32])pMVar21 = *(undefined1 (*) [32])(*pauVar16 + lVar14)
                          ;
                          pMVar21 = (Mat *)&pMVar21->allocator;
                          lVar33 = uVar12 * 0x20 + lVar14;
                          lVar14 = lVar14 + -0x20;
                        } while (lVar33 != -0x20);
                      }
                      pauVar20 = (undefined1 (*) [32])
                                 ((long)pauVar20 + (long)(int)(uVar11 * 8) * -4);
                      iVar29 = iVar29 + 1;
                    } while (iVar29 != iVar24);
                  }
                  if (0 < iVar8) {
                    iVar24 = 0;
                    do {
                      lVar14 = uVar18 << 5;
                      if (0 < (int)uVar22) {
                        do {
                          *(undefined1 (*) [32])pMVar21 = *(undefined1 (*) [32])(*pauVar20 + lVar14)
                          ;
                          pMVar21 = (Mat *)&pMVar21->allocator;
                          lVar14 = lVar14 + -0x20;
                        } while (lVar14 != 0);
                      }
                      if (0 < (int)uVar11) {
                        iVar29 = 0;
                        do {
                          *(undefined1 (*) [32])pMVar21 = *pauVar20;
                          pauVar20 = pauVar20 + 1;
                          pMVar21 = (Mat *)&pMVar21->allocator;
                          iVar29 = iVar29 + 1;
                        } while (iVar29 < (int)uVar11);
                      }
                      if (0 < (int)uVar3) {
                        lVar14 = -0x40;
                        do {
                          *(undefined1 (*) [32])pMVar21 = *(undefined1 (*) [32])(*pauVar20 + lVar14)
                          ;
                          pMVar21 = (Mat *)&pMVar21->allocator;
                          lVar33 = uVar12 * 0x20 + lVar14;
                          lVar14 = lVar14 + -0x20;
                        } while (lVar33 != -0x20);
                      }
                      iVar24 = iVar24 + 1;
                    } while (iVar24 < iVar8);
                  }
                  if (0 < iVar2) {
                    uVar31 = (ulong)(int)uVar11;
                    pauVar20 = pauVar20 + uVar31 * -2;
                    iVar8 = 0;
                    do {
                      lVar14 = uVar18 << 5;
                      if (0 < (int)uVar22) {
                        do {
                          *(undefined1 (*) [32])pMVar21 = *(undefined1 (*) [32])(*pauVar20 + lVar14)
                          ;
                          pMVar21 = (Mat *)&pMVar21->allocator;
                          lVar14 = lVar14 + -0x20;
                        } while (lVar14 != 0);
                        uVar31 = (ulong)uVar11;
                      }
                      pauVar16 = pauVar20;
                      if (0 < (int)uVar31) {
                        iVar24 = 0;
                        do {
                          *(undefined1 (*) [32])pMVar21 = *pauVar16;
                          pauVar16 = pauVar16 + 1;
                          pMVar21 = (Mat *)&pMVar21->allocator;
                          iVar24 = iVar24 + 1;
                          uVar31 = (ulong)uVar11;
                        } while (iVar24 < (int)uVar11);
                      }
                      if (0 < (int)uVar3) {
                        lVar14 = -0x40;
                        do {
                          *(undefined1 (*) [32])pMVar21 = *(undefined1 (*) [32])(*pauVar16 + lVar14)
                          ;
                          pMVar21 = (Mat *)&pMVar21->allocator;
                          lVar33 = uVar12 * 0x20 + lVar14;
                          lVar14 = lVar14 + -0x20;
                        } while (lVar33 != -0x20);
                        uVar31 = (ulong)uVar11;
                      }
                      pauVar20 = (undefined1 (*) [32])
                                 ((long)pauVar20 + (long)((int)uVar31 * 8) * -4);
                      iVar8 = iVar8 + 1;
                    } while (iVar8 != iVar2);
                  }
                }
              }
              uVar34 = uVar34 + 1;
            } while (uVar34 != (uint)((int)uVar35 >> 3));
            return 0;
          }
        }
        break;
      case 4:
        if (*(int *)(&this->field_0xe0 + (long)p_Var19) == 0) {
          uVar11 = *(int *)(&this->field_0xe8 + (long)p_Var19) + iVar2 +
                   *(int *)(&this->field_0xec + (long)p_Var19);
          pAVar40 = opt->blob_allocator;
          Mat::create(top_blob,iVar26 + *(int *)(&this->field_0xd8 + (long)p_Var19) +
                               *(int *)(&this->field_0xdc + (long)p_Var19),
                      uVar22 + iVar24 + *(int *)(&this->field_0xd4 + (long)p_Var19),uVar11,uVar25,
                      uVar34,8,pAVar40);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep != 0) {
            if ((int)uVar25 < 1) {
              return 0;
            }
            uVar34 = 0;
            do {
              p_Var19 = this->_vptr_Padding_x86_avx2[-3];
              if (*(int *)(&this->field_0xf0 + (long)p_Var19) == 0) {
                uVar1 = *(undefined4 *)(&this->field_0xe4 + (long)p_Var19);
                auVar39._4_4_ = uVar1;
                auVar39._0_4_ = uVar1;
                auVar39._8_4_ = uVar1;
                auVar39._12_4_ = uVar1;
                auVar39._16_4_ = uVar1;
                auVar39._20_4_ = uVar1;
                auVar39._24_4_ = uVar1;
                auVar39._28_4_ = uVar1;
              }
              else {
                auVar39 = *(undefined1 (*) [32])
                           (*(long *)(&this->field_0xf8 + (long)p_Var19) + uVar34 * 0x20);
              }
              pPVar41 = this;
              if (0 < (int)uVar11) {
                uVar18 = 0;
                do {
                  uVar12 = (long)top_blob->h * (long)top_blob->w;
                  pMVar21 = (Mat *)((long)top_blob->data +
                                   top_blob->elemsize * uVar18 * uVar12 +
                                   top_blob->cstep * uVar34 * top_blob->elemsize);
                  p_Var19 = this->_vptr_Padding_x86_avx2[-3];
                  uVar22 = (int)uVar18 - *(int *)(&this->field_0xe8 + (long)p_Var19);
                  if ((int)uVar22 < 0 || iVar2 <= (int)uVar22) {
                    if (0 < (int)uVar12) {
                      do {
                        pMVar21->data = (void *)auVar39._0_8_;
                        pMVar21->refcount = (int *)auVar39._8_8_;
                        pMVar21->elemsize = auVar39._16_8_;
                        pMVar21->elempack = auVar39._24_4_;
                        *(int *)&pMVar21->field_0x1c = auVar39._28_4_;
                        pMVar21 = (Mat *)&pMVar21->allocator;
                        uVar22 = (int)uVar12 - 1;
                        uVar12 = (ulong)uVar22;
                      } while (uVar22 != 0);
                    }
                  }
                  else {
                    v_01[2] = (float)(int)in_stack_fffffffffffffed8;
                    v_01[3] = (float)(int)((ulong)in_stack_fffffffffffffed8 >> 0x20);
                    v_01._0_8_ = pAVar40;
                    v_01._16_8_ = pPVar41;
                    v_01._24_8_ = (long)bottom_blob->data +
                                  bottom_blob->elemsize *
                                  (long)bottom_blob->h * (long)bottom_blob->w * (ulong)uVar22 +
                                  bottom_blob->cstep * uVar34 * bottom_blob->elemsize;
                    pPVar42 = pPVar41;
                    padding_constant_pack8_avx
                              ((ncnn *)&stack0xfffffffffffffee8,pMVar21,(Mat *)(long)top_blob->w,
                               *(int *)(&pPVar41->field_0xd0 + (long)p_Var19),
                               *(int *)(&pPVar41->field_0xd4 + (long)p_Var19),
                               *(int *)(&pPVar41->field_0xd8 + (long)p_Var19),
                               *(int *)(&pPVar41->field_0xdc + (long)p_Var19),v_01);
                    this = pPVar41;
                    pPVar41 = pPVar42;
                  }
                  uVar18 = uVar18 + 1;
                } while (uVar18 != uVar11);
              }
              uVar34 = uVar34 + 1;
              this = pPVar41;
            } while (uVar34 != uVar25);
            return 0;
          }
          return -100;
        }
      }
    }
  }
  piVar6 = bottom_blob->refcount;
  pvVar43 = bottom_blob->data;
  piVar7 = bottom_blob->refcount;
  pAVar40 = bottom_blob->allocator;
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + 1;
    UNLOCK();
  }
  if (iVar8 != 1) {
    local_78.lightmode = opt->lightmode;
    local_78._1_3_ = *(undefined3 *)&opt->field_0x1;
    local_78.num_threads = opt->num_threads;
    local_78.workspace_allocator = opt->workspace_allocator;
    local_78.openmp_blocktime = opt->openmp_blocktime;
    local_78.use_winograd_convolution = opt->use_winograd_convolution;
    local_78.use_sgemm_convolution = opt->use_sgemm_convolution;
    local_78.use_int8_inference = opt->use_int8_inference;
    local_78.use_vulkan_compute = opt->use_vulkan_compute;
    local_78.use_bf16_storage = opt->use_bf16_storage;
    local_78.use_fp16_packed = opt->use_fp16_packed;
    local_78.use_fp16_storage = opt->use_fp16_storage;
    local_78.use_fp16_arithmetic = opt->use_fp16_arithmetic;
    local_78.use_int8_packed = opt->use_int8_packed;
    local_78.use_int8_storage = opt->use_int8_storage;
    local_78.use_int8_arithmetic = opt->use_int8_arithmetic;
    local_78.use_packing_layout = opt->use_packing_layout;
    local_78.use_shader_pack8 = opt->use_shader_pack8;
    local_78.use_subgroup_basic = opt->use_subgroup_basic;
    local_78.use_subgroup_vote = opt->use_subgroup_vote;
    local_78.use_subgroup_ballot = opt->use_subgroup_ballot;
    local_78.use_subgroup_shuffle = opt->use_subgroup_shuffle;
    local_78.use_image_storage = opt->use_image_storage;
    local_78.use_tensor_storage = opt->use_tensor_storage;
    local_78.use_weight_fp16_storage = opt->use_weight_fp16_storage;
    local_78.flush_denormals = opt->flush_denormals;
    local_78.use_local_pool_allocator = opt->use_local_pool_allocator;
    local_78.use_reserved_1 = opt->use_reserved_1;
    local_78.use_reserved_2 = opt->use_reserved_2;
    local_78.use_reserved_3 = opt->use_reserved_3;
    local_78.use_reserved_4 = opt->use_reserved_4;
    local_78.use_reserved_5 = opt->use_reserved_5;
    local_78.use_reserved_6 = opt->use_reserved_6;
    local_78.use_reserved_7 = opt->use_reserved_7;
    local_78.use_reserved_8 = opt->use_reserved_8;
    local_78.use_reserved_9 = opt->use_reserved_9;
    local_78.use_reserved_10 = opt->use_reserved_10;
    local_78.use_reserved_11 = opt->use_reserved_11;
    local_78.blob_allocator = opt->workspace_allocator;
    convert_packing(bottom_blob,(Mat *)&stack0xfffffffffffffee8,1,&local_78);
  }
  iVar8 = Padding::forward((Padding *)
                           ((long)&this->_vptr_Padding_x86_avx2 +
                           (long)this->_vptr_Padding_x86_avx2[-3]),(Mat *)&stack0xfffffffffffffee8,
                           top_blob,opt);
  if (piVar7 != (int *)0x0) {
    LOCK();
    *piVar7 = *piVar7 + -1;
    UNLOCK();
    if (*piVar7 == 0) {
      if (pAVar40 == (Allocator *)0x0) {
        if (pvVar43 != (void *)0x0) {
          free(pvVar43);
        }
      }
      else {
        (*pAVar40->_vptr_Allocator[3])();
      }
    }
  }
  return iVar8;
}

Assistant:

int Padding_x86_avx2::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (top == 0 && bottom == 0 && left == 0 && right == 0 && front == 0 && behind == 0)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int elembits = bottom_blob.elembits();

    if (elembits == 8)
        return forward_int8(bottom_blob, top_blob, opt);

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __SSE2__
#if __AVX__
    if (elempack == 8)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

            int out_elempack = outw % 8 == 0 ? 8 : outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m256 pad_value = _mm256_set1_ps(value);
                padding_constant_pack8_avx(bottom_blob, top_blob, 0, 0, left / 8, right / 8, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

            int out_elempack = outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m256 pad_value = _mm256_set1_ps(value);
                padding_constant_pack8_avx(bottom_blob, top_blob, top / 8, bottom / 8, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

            int out_elempack = outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 8 == 0 && out_elempack == 8 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    __m256 pad_value = per_channel_pad_data_size ? _mm256_loadu_ps((const float*)per_channel_pad_data + q * 8) : _mm256_set1_ps(value);
                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack8_avx(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack8_avx(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack8_avx(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    __m256 pad_value = per_channel_pad_data_size ? _mm256_loadu_ps((const float*)per_channel_pad_data + q * 8) : _mm256_set1_ps(value);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack8_avx(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

#if __AVX__
            int out_elempack = outw % 8 == 0 ? 8 : outw % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outw % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 4 == 0 && out_elempack == 4 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m128 pad_value = _mm_set1_ps(value);
                padding_constant_pack4_sse(bottom_blob, top_blob, 0, 0, left / 4, right / 4, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

#if __AVX__
            int out_elempack = outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outh % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 4 == 0 && out_elempack == 4 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m128 pad_value = _mm_set1_ps(value);
                padding_constant_pack4_sse(bottom_blob, top_blob, top / 4, bottom / 4, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

#if __AVX__
            int out_elempack = outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outc % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 4 == 0 && out_elempack == 4 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    __m128 pad_value = per_channel_pad_data_size ? _mm_loadu_ps((const float*)per_channel_pad_data + q * 4) : _mm_set1_ps(value);
                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack4_sse(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack4_sse(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack4_sse(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    __m128 pad_value = per_channel_pad_data_size ? _mm_loadu_ps((const float*)per_channel_pad_data + q * 4) : _mm_set1_ps(value);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack4_sse(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    Mat bottom_blob_unpacked = bottom_blob;
    if (elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack1);
    }

    return Padding::forward(bottom_blob_unpacked, top_blob, opt);
}